

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stoch.c
# Opt level: O1

ErrorNumber test_func_stoch(TA_History *history)

{
  TestId TVar1;
  TA_RetCode TVar2;
  ErrorNumber EVar3;
  ulong uVar4;
  TA_Test_conflict15 *pTVar5;
  ulong uVar6;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict15 *local_50;
  TA_Real *local_48;
  TA_Real *pTStack_40;
  TA_Real *local_38;
  
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
  pTVar5 = tableTest;
  uVar6 = 0;
  do {
    if ((int)history->nbBars < pTVar5->expectedNbElement) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_stoch.c"
             ,uVar6 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->high,history->nbBars);
    setInputBuffer(1,history->low,history->nbBars);
    setInputBuffer(2,history->close,history->nbBars);
    TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
    TVar2 = TA_NOT_SUPPORTED;
    if (pTVar5->optInMAType_1 == 1) {
      TVar2 = TA_SetUnstablePeriod(TA_FUNC_UNST_EMA,pTVar5->unstablePeriod);
      uVar4 = 0x8a;
      if (TVar2 == TA_SUCCESS) {
        TVar2 = TA_SUCCESS;
        goto LAB_0011b6be;
      }
    }
    else {
LAB_0011b6be:
      TVar1 = pTVar5->testId;
      if (TVar1 == TEST_STOCHRSI) {
        TVar2 = TA_STOCHRSI(pTVar5->startIdx,pTVar5->endIdx,gBuffer[2].in,pTVar5->optInPeriod_0,
                            pTVar5->optInPeriod_1,pTVar5->optInPeriod_2,pTVar5->optInMAType_2,
                            &outBegIdx,&outNbElement,gBuffer[0].out0,gBuffer[0].out1);
      }
      else if (TVar1 == TEST_STOCHF) {
        TVar2 = TA_STOCHF(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                          pTVar5->optInPeriod_0,pTVar5->optInPeriod_1,pTVar5->optInMAType_1,
                          &outBegIdx,&outNbElement,gBuffer[0].out0,gBuffer[0].out1);
      }
      else if (TVar1 == TEST_STOCH) {
        TVar2 = TA_STOCH(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                         pTVar5->optInPeriod_0,pTVar5->optInPeriod_1,pTVar5->optInMAType_1,
                         pTVar5->optInPeriod_2,pTVar5->optInMAType_2,&outBegIdx,&outNbElement,
                         gBuffer[0].out0,gBuffer[0].out1);
      }
      EVar3 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
      if (((EVar3 == TA_TEST_PASS) &&
          (EVar3 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar3 == TA_TEST_PASS)
          ) && (EVar3 = checkDataSame(gBuffer[2].in,history->close,history->nbBars),
               EVar3 == TA_TEST_PASS)) {
        EVar3 = checkExpectedValue(gBuffer[0].out0,TVar2,pTVar5->expectedRetCode,outBegIdx,
                                   pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                                   pTVar5->oneOfTheExpectedOutReal0,
                                   pTVar5->oneOfTheExpectedOutRealIndex0);
        if ((EVar3 != TA_TEST_PASS) ||
           (EVar3 = checkExpectedValue(gBuffer[0].out1,TVar2,pTVar5->expectedRetCode,outBegIdx,
                                       pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement
                                       ,pTVar5->oneOfTheExpectedOutReal1,
                                       pTVar5->oneOfTheExpectedOutRealIndex1), EVar3 != TA_TEST_PASS
           )) {
LAB_0011b8bb:
          uVar4 = (ulong)EVar3;
          printf("Fail for output id=%d\n");
          goto LAB_0011b817;
        }
        outNbElement = 0;
        outBegIdx = 0;
        if (pTVar5->testId == TEST_STOCH) {
          TVar2 = referenceStoch(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,gBuffer[1].in,
                                 gBuffer[2].in,pTVar5->optInPeriod_0,pTVar5->optInPeriod_1,
                                 pTVar5->optInMAType_1,pTVar5->optInPeriod_2,pTVar5->optInMAType_2,
                                 &outBegIdx,&outNbElement,gBuffer[1].out0,gBuffer[1].out1);
          EVar3 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
          if (((EVar3 == TA_TEST_PASS) &&
              (EVar3 = checkDataSame(gBuffer[1].in,history->low,history->nbBars),
              EVar3 == TA_TEST_PASS)) &&
             (EVar3 = checkDataSame(gBuffer[2].in,history->close,history->nbBars),
             EVar3 == TA_TEST_PASS)) {
            EVar3 = checkExpectedValue(gBuffer[1].out0,TVar2,pTVar5->expectedRetCode,outBegIdx,
                                       pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement
                                       ,pTVar5->oneOfTheExpectedOutReal0,
                                       pTVar5->oneOfTheExpectedOutRealIndex0);
            if ((EVar3 != TA_TEST_PASS) ||
               (EVar3 = checkExpectedValue(gBuffer[1].out1,TVar2,pTVar5->expectedRetCode,outBegIdx,
                                           pTVar5->expectedBegIdx,outNbElement,
                                           pTVar5->expectedNbElement,
                                           pTVar5->oneOfTheExpectedOutReal1,
                                           pTVar5->oneOfTheExpectedOutRealIndex1),
               EVar3 != TA_TEST_PASS)) goto LAB_0011b8bb;
            EVar3 = checkSameContent(gBuffer[1].out0,gBuffer[0].out0);
            if ((EVar3 == TA_TEST_PASS) &&
               (EVar3 = checkSameContent(gBuffer[1].out1,gBuffer[0].out1), EVar3 == TA_TEST_PASS))
            goto LAB_0011b8d6;
          }
        }
        else {
LAB_0011b8d6:
          TVar1 = pTVar5->testId;
          if (TVar1 == TEST_STOCHRSI) {
            TVar2 = TA_STOCHRSI(pTVar5->startIdx,pTVar5->endIdx,gBuffer[2].in,pTVar5->optInPeriod_0,
                                pTVar5->optInPeriod_1,pTVar5->optInPeriod_2,pTVar5->optInMAType_2,
                                &outBegIdx,&outNbElement,gBuffer[0].in,gBuffer[1].in);
          }
          else if (TVar1 == TEST_STOCHF) {
            TVar2 = TA_STOCHF(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,gBuffer[1].in,
                              gBuffer[2].in,pTVar5->optInPeriod_0,pTVar5->optInPeriod_1,
                              pTVar5->optInMAType_1,&outBegIdx,&outNbElement,gBuffer[0].in,
                              gBuffer[1].in);
          }
          else if (TVar1 == TEST_STOCH) {
            TVar2 = TA_STOCH(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,gBuffer[1].in,
                             gBuffer[2].in,pTVar5->optInPeriod_0,pTVar5->optInPeriod_1,
                             pTVar5->optInMAType_1,pTVar5->optInPeriod_2,pTVar5->optInMAType_2,
                             &outBegIdx,&outNbElement,gBuffer[0].in,gBuffer[1].in);
          }
          EVar3 = checkSameContent(gBuffer[0].out0,gBuffer[0].in);
          if ((EVar3 == TA_TEST_PASS) &&
             (EVar3 = checkSameContent(gBuffer[0].out1,gBuffer[1].in), EVar3 == TA_TEST_PASS)) {
            EVar3 = checkExpectedValue(gBuffer[0].in,TVar2,pTVar5->expectedRetCode,outBegIdx,
                                       pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement
                                       ,pTVar5->oneOfTheExpectedOutReal0,
                                       pTVar5->oneOfTheExpectedOutRealIndex0);
            if ((EVar3 == TA_TEST_PASS) &&
               (EVar3 = checkExpectedValue(gBuffer[1].in,TVar2,pTVar5->expectedRetCode,outBegIdx,
                                           pTVar5->expectedBegIdx,outNbElement,
                                           pTVar5->expectedNbElement,
                                           pTVar5->oneOfTheExpectedOutReal1,
                                           pTVar5->oneOfTheExpectedOutRealIndex1),
               EVar3 == TA_TEST_PASS)) {
              local_48 = history->high;
              pTStack_40 = history->low;
              local_38 = history->close;
              local_50 = pTVar5;
              if (pTVar5->doRangeTestFlag != 0) {
                uVar4 = 0;
                if ((ulong)pTVar5->testId < 3) {
                  EVar3 = doRangeTest(rangeTestFunction,
                                      *(TA_FuncUnstId *)(&DAT_0018889c + (ulong)pTVar5->testId * 4),
                                      &local_50,2,0);
                  uVar4 = (ulong)EVar3;
                }
                if ((int)uVar4 != 0) goto LAB_0011b817;
              }
              uVar4 = 0;
              goto LAB_0011b817;
            }
            goto LAB_0011b8bb;
          }
        }
      }
      uVar4 = (ulong)EVar3;
    }
LAB_0011b817:
    if ((ErrorNumber)uVar4 != TA_TEST_PASS) {
      printf("%s Failed Test #%d (Code=%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_stoch.c"
             ,uVar6 & 0xffffffff,uVar4);
      return (ErrorNumber)uVar4;
    }
    uVar6 = uVar6 + 1;
    pTVar5 = pTVar5 + 1;
    if (uVar6 == 0xb) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_stoch( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}